

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O2

void __thiscall
Signal<const_cluster_head_msg_&>::emit(Signal<const_cluster_head_msg_&> *this,cluster_head_msg *p)

{
  _Base_ptr p_Var1;
  undefined1 local_58 [8];
  pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_> it;
  
  for (p_Var1 = (this->slots_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->slots_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_>::pair
              ((pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_> *)local_58,
               (pair<const_int,_std::function<void_(const_cluster_head_msg_&)>_> *)(p_Var1 + 1));
    std::function<void_(const_cluster_head_msg_&)>::operator()
              ((function<void_(const_cluster_head_msg_&)> *)&it,p);
    std::_Function_base::~_Function_base((_Function_base *)&it);
  }
  return;
}

Assistant:

void emit(Args... p) {
    for(auto it : slots_) {
      it.second(p...);
    }
  }